

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpromisehelpers.h
# Opt level: O1

Type QtPromise::resolve<float_const&>(float *value)

{
  QSharedData *pQVar1;
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<float>::Data> QVar2;
  undefined8 *puVar3;
  PromiseData<float> *extraout_RDX;
  PromiseData<float> *extraout_RDX_00;
  PromiseData<float> *extraout_RDX_01;
  PromiseData<float> *extraout_RDX_02;
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseData<float>_> QVar4;
  Type TVar5;
  PromiseResolver<float> resolver;
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<float>::Data> local_48;
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<float>::Data> local_40;
  QPromise<float> local_38;
  
  *(undefined ***)value = &PTR__QPromiseBase_001327c0;
  puVar3 = (undefined8 *)operator_new(0x68);
  *puVar3 = 0;
  puVar3[1] = 0;
  puVar3[2] = 0;
  puVar3[3] = 0;
  puVar3[4] = 0;
  puVar3[5] = 0;
  puVar3[6] = 0;
  puVar3[7] = 0;
  puVar3[8] = 0;
  puVar3[9] = 0;
  puVar3[10] = 0;
  puVar3[0xb] = 0;
  puVar3[0xc] = 0;
  *puVar3 = &PTR__PromiseDataBase_00132be0;
  QReadWriteLock::QReadWriteLock((QReadWriteLock *)(puVar3 + 2),0);
  *(undefined1 *)(puVar3 + 3) = 0;
  puVar3[4] = 0;
  puVar3[5] = 0;
  puVar3[6] = 0;
  puVar3[7] = 0;
  puVar3[8] = 0;
  puVar3[9] = 0;
  puVar3[10] = 0;
  *puVar3 = &PTR__PromiseData_00132b78;
  puVar3[0xb] = 0;
  puVar3[0xc] = 0;
  *(undefined8 **)(value + 2) = puVar3;
  LOCK();
  *(int *)(puVar3 + 1) = *(int *)(puVar3 + 1) + 1;
  UNLOCK();
  local_38.super_QPromiseBase<float>.m_d.d = *(PromiseData<float> **)(value + 2);
  if (local_38.super_QPromiseBase<float>.m_d.d != (PromiseData<float> *)0x0) {
    LOCK();
    pQVar1 = &((local_38.super_QPromiseBase<float>.m_d.d)->
              super_PromiseDataBase<float,_void_(const_float_&)>).super_QSharedData;
    (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
    super___atomic_base<int>._M_i =
         (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  local_38.super_QPromiseBase<float>._vptr_QPromiseBase = (_func_int **)&PTR__QPromiseBase_00132b40;
  QtPromisePrivate::PromiseResolver<float>::PromiseResolver
            ((PromiseResolver<float> *)&local_40,&local_38);
  local_38.super_QPromiseBase<float>._vptr_QPromiseBase = (_func_int **)&PTR__QPromiseBase_001327c0;
  if (local_38.super_QPromiseBase<float>.m_d.d != (PromiseData<float> *)0x0) {
    LOCK();
    pQVar1 = &((local_38.super_QPromiseBase<float>.m_d.d)->
              super_PromiseDataBase<float,_void_(const_float_&)>).super_QSharedData;
    (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
    super___atomic_base<int>._M_i =
         (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i == 0) &&
       (local_38.super_QPromiseBase<float>.m_d.d != (PromiseData<float> *)0x0)) {
      (*((local_38.super_QPromiseBase<float>.m_d.d)->
        super_PromiseDataBase<float,_void_(const_float_&)>)._vptr_PromiseDataBase[1])();
    }
  }
  QVar2.d = local_40.d;
  if (local_40.d != (Data *)0x0) {
    LOCK();
    ((local_40.d)->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
    _q_value.super___atomic_base<int>._M_i =
         ((local_40.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
         super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  local_48.d = local_40.d;
  if (local_40.d != (Data *)0x0) {
    LOCK();
    ((local_40.d)->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
    _q_value.super___atomic_base<int>._M_i =
         ((local_40.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
         super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  QtPromisePrivate::PromiseResolver<float>::resolve<float_const&>
            ((PromiseResolver<float> *)&local_48,(float *)&(anonymous_namespace)::kRes);
  QVar4.d = extraout_RDX;
  if (QVar2.d != (Data *)0x0) {
    LOCK();
    ((QVar2.d)->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
    _q_value.super___atomic_base<int>._M_i =
         ((QVar2.d)->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>
         ._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((QVar2.d)->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
        _q_value.super___atomic_base<int>._M_i == 0) {
      operator_delete(QVar2.d,0x10);
      QVar4.d = extraout_RDX_00;
    }
  }
  if (local_48.d != (Data *)0x0) {
    LOCK();
    ((local_48.d)->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
    _q_value.super___atomic_base<int>._M_i =
         ((local_48.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
         super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((((local_48.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
         super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i == 0) &&
       (local_48.d != (Data *)0x0)) {
      operator_delete(local_48.d,0x10);
      QVar4.d = extraout_RDX_01;
    }
  }
  if (local_40.d != (Data *)0x0) {
    LOCK();
    ((local_40.d)->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
    _q_value.super___atomic_base<int>._M_i =
         ((local_40.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
         super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((((local_40.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
         super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i == 0) &&
       (local_40.d != (Data *)0x0)) {
      operator_delete(local_40.d,0x10);
      QVar4.d = extraout_RDX_02;
    }
  }
  *(undefined ***)value = &PTR__QPromiseBase_00132b40;
  TVar5.super_QPromiseBase<float>.m_d.d = QVar4.d;
  TVar5.super_QPromiseBase<float>._vptr_QPromiseBase = (_func_int **)value;
  return (Type)TVar5.super_QPromiseBase<float>;
}

Assistant:

static inline typename QtPromisePrivate::PromiseDeduce<T>::Type resolve(T&& value)
{
    using namespace QtPromisePrivate;
    using PromiseType = typename PromiseDeduce<T>::Type;
    using ValueType = typename PromiseType::Type;
    using ResolveType = QPromiseResolve<ValueType>;
    using RejectType = QPromiseReject<ValueType>;

    return PromiseType{[&](ResolveType&& resolve, RejectType&& reject) {
        PromiseFulfill<Unqualified<T>>::call(std::forward<T>(value),
                                             std::forward<ResolveType>(resolve),
                                             std::forward<RejectType>(reject));
    }};
}